

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O1

vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
* geometrycentral::surface::anon_unknown_19::paramToStdVector
            (vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
             *__return_storage_ptr__,SurfaceMesh *mesh,CornerData<Vector2> *param)

{
  vector<geometrycentral::Vector2,std::allocator<geometrycentral::Vector2>> *this;
  pointer puVar1;
  unsigned_long uVar2;
  iterator __position;
  double dVar3;
  long lVar4;
  size_t sVar5;
  Vector2 *__args;
  size_t sVar6;
  long lVar7;
  size_t i;
  unsigned_long uVar8;
  allocator_type local_51;
  size_t local_50;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *local_48;
  size_t local_40;
  long local_38;
  
  local_48 = __return_storage_ptr__;
  ::std::
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  ::vector(__return_storage_ptr__,mesh->nFacesCount,&local_51);
  local_50 = mesh->nFacesFillCount;
  if ((local_50 == 0) ||
     (puVar1 = (mesh->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar1 != 0xffffffffffffffff)) {
    sVar5 = 0;
  }
  else {
    sVar6 = 0;
    do {
      sVar5 = local_50;
      if (local_50 - 1 == sVar6) break;
      sVar5 = sVar6 + 1;
      lVar7 = sVar6 + 1;
      sVar6 = sVar5;
    } while (puVar1[lVar7] == 0xffffffffffffffff);
  }
  if (sVar5 != local_50) {
    local_40 = local_50 - 1;
    lVar7 = 0;
    do {
      uVar2 = (mesh->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[sVar5];
      uVar8 = uVar2;
      local_38 = lVar7;
      do {
        this = (vector<geometrycentral::Vector2,std::allocator<geometrycentral::Vector2>> *)
               ((local_48->
                super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar7);
        __args = (param->data).
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data + uVar8;
        __position._M_current = *(Vector2 **)(this + 8);
        if (__position._M_current == *(Vector2 **)(this + 0x10)) {
          ::std::vector<geometrycentral::Vector2,std::allocator<geometrycentral::Vector2>>::
          _M_realloc_insert<geometrycentral::Vector2_const&>(this,__position,__args);
        }
        else {
          dVar3 = __args->y;
          (__position._M_current)->x = __args->x;
          (__position._M_current)->y = dVar3;
          *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
        }
        uVar8 = (mesh->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar8];
      } while (uVar8 != uVar2);
      lVar7 = local_38 + 1;
      sVar6 = sVar5;
      do {
        sVar5 = local_50;
        if (local_40 == sVar6) break;
        sVar5 = sVar6 + 1;
        lVar4 = sVar6 + 1;
        sVar6 = sVar5;
      } while ((mesh->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4] == 0xffffffffffffffff);
    } while (sVar5 != local_50);
  }
  return local_48;
}

Assistant:

std::vector<std::vector<Vector2>> paramToStdVector(SurfaceMesh& mesh, CornerData<Vector2>& param) {
  std::vector<std::vector<Vector2>> uv(mesh.nFaces());
  size_t i = 0;
  for (Face f : mesh.faces()) {
    for (Corner c : f.adjacentCorners()) {
      uv[i].push_back(param[c]);
    }
    i++;
  }
  return uv;
}